

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zsp_blas2.c
# Opt level: O1

int sp_ztrsv(char *uplo,char *trans,char *diag,SuperMatrix *L,SuperMatrix *U,doublecomplex *x,
            SuperLUStat_t *stat,int *info)

{
  double dVar1;
  double dVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  bool bVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  ulong uVar16;
  doublecomplex *pdVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  float fVar28;
  int nsupc;
  int nsupr;
  SuperMatrix *local_188;
  long local_180;
  long local_178;
  void *local_170;
  double local_168;
  int incx;
  double local_158;
  double *local_150;
  char *local_148;
  doublecomplex *local_140;
  doublecomplex temp;
  
  incx = 1;
  *info = 0;
  if ((*uplo == 'U') || (iVar22 = -1, *uplo == 'L')) {
    iVar22 = -2;
    if (((0x11 < (byte)*trans - 0x43) || ((0x20801U >> ((byte)*trans - 0x43 & 0x1f) & 1) == 0)) ||
       ((*diag != 'U' && (iVar22 = -3, *diag != 'N')))) goto LAB_0010e40e;
    iVar22 = -4;
    if ((L->nrow < 0) || (L->nrow != L->ncol)) goto LAB_0010e40e;
    iVar22 = -5;
    if ((U->nrow < 0) || (U->nrow != U->ncol)) goto LAB_0010e40e;
  }
  else {
LAB_0010e40e:
    *info = iVar22;
  }
  if (*info != 0) {
    temp.r = (double)CONCAT44(temp.r._4_4_,-*info);
    input_error("sp_ztrsv",(int *)&temp);
    return 0;
  }
  pvVar8 = L->Store;
  local_178 = *(long *)((long)pvVar8 + 8);
  pvVar9 = U->Store;
  local_180 = *(long *)((long)pvVar9 + 8);
  local_188 = U;
  local_140 = doublecomplexCalloc((long)L->nrow);
  if (local_140 == (doublecomplex *)0x0) {
    sprintf((char *)&temp,"%s at line %d in file %s\n","Malloc fails for work in sp_ztrsv().",0x81,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zsp_blas2.c");
    superlu_abort_and_exit((char *)&temp);
  }
  cVar3 = *uplo;
  local_170 = pvVar8;
  local_148 = trans;
  if (*trans == 'T') {
    if (cVar3 == 'L') {
      if (L->nrow == 0) {
        return 0;
      }
      dVar26 = (double)(long)*(int *)((long)pvVar8 + 4);
      if (-1 < (long)dVar26) {
        local_180 = local_178 + 8;
        fVar28 = 0.0;
        do {
          lVar15 = *(long *)((long)local_170 + 0x30);
          iVar22 = *(int *)(lVar15 + (long)dVar26 * 4);
          local_158 = (double)(long)iVar22;
          iVar5 = *(int *)(*(long *)((long)local_170 + 0x20) + (long)local_158 * 4);
          nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + (long)local_158 * 4) - iVar5;
          nsupc = *(int *)(lVar15 + 4 + (long)dVar26 * 4) - iVar22;
          lVar13 = *(long *)((long)local_170 + 0x10);
          local_150 = (double *)(long)*(int *)(lVar13 + (long)local_158 * 4);
          iVar19 = *(int *)(lVar15 + 4 + (long)dVar26 * 4);
          if (iVar22 < iVar19) {
            dVar27 = local_158;
            do {
              lVar15 = (long)*(int *)(lVar13 + (long)dVar27 * 4) + (long)nsupc;
              iVar22 = *(int *)(lVar13 + 4 + (long)dVar27 * 4);
              if ((int)lVar15 < iVar22) {
                dVar24 = x[(long)dVar27].r;
                dVar25 = x[(long)dVar27].i;
                lVar21 = *(long *)((long)local_170 + 0x18);
                lVar23 = lVar15 * 0x10 + local_180;
                lVar12 = 0;
                do {
                  iVar20 = *(int *)(lVar21 + (long)(iVar5 + nsupc) * 4 + lVar12);
                  dVar2 = *(double *)(lVar23 + -8 + lVar12 * 4);
                  dVar1 = *(double *)(lVar23 + lVar12 * 4);
                  dVar24 = dVar24 - (x[iVar20].r * dVar2 - dVar1 * x[iVar20].i);
                  dVar25 = dVar25 - (x[iVar20].i * dVar2 + x[iVar20].r * dVar1);
                  x[(long)dVar27].r = dVar24;
                  x[(long)dVar27].i = dVar25;
                  lVar15 = lVar15 + 1;
                  lVar12 = lVar12 + 4;
                } while (lVar15 < iVar22);
              }
              dVar27 = (double)((long)dVar27 + 1);
            } while (dVar27 != (double)(long)iVar19);
          }
          fVar28 = fVar28 + (float)((nsupr - nsupc) * nsupc * 8);
          local_168 = dVar26;
          if (1 < nsupc) {
            local_188 = (SuperMatrix *)
                        CONCAT44(local_188._4_4_,fVar28 + (float)((nsupc + -1) * nsupc * 4));
            ztrsv_("L","T","U",&nsupc,(doublecomplex *)((long)local_150 * 0x10 + local_178),&nsupr,
                   x + (long)local_158,&incx);
            fVar28 = local_188._0_4_;
          }
          dVar26 = (double)((long)local_168 + -1);
        } while (0 < (long)local_168);
        goto LAB_0010f0ea;
      }
    }
    else {
      if (local_188->nrow == 0) {
        return 0;
      }
      if (-1 < *(int *)((long)pvVar8 + 4)) {
        local_180 = local_180 + 8;
        fVar28 = 0.0;
        dVar26 = 0.0;
        do {
          lVar15 = *(long *)((long)local_170 + 0x30);
          iVar22 = *(int *)(lVar15 + (long)dVar26 * 4);
          lVar13 = (long)iVar22;
          nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + lVar13 * 4) -
                  *(int *)(*(long *)((long)local_170 + 0x20) + lVar13 * 4);
          iVar19 = *(int *)(lVar15 + 4 + (long)dVar26 * 4) - iVar22;
          lVar21 = (long)*(int *)(*(long *)((long)local_170 + 0x10) + lVar13 * 4);
          iVar5 = *(int *)(lVar15 + 4 + (long)dVar26 * 4);
          if (iVar22 < iVar5) {
            lVar15 = *(long *)((long)pvVar9 + 0x18);
            lVar12 = lVar13;
            do {
              iVar22 = *(int *)(lVar15 + 4 + lVar12 * 4);
              iVar20 = *(int *)(lVar15 + lVar12 * 4);
              lVar23 = (long)iVar20;
              if (iVar22 - iVar20 != 0 && iVar20 <= iVar22) {
                lVar10 = *(long *)((long)pvVar9 + 0x10);
                dVar27 = x[lVar12].r;
                dVar24 = x[lVar12].i;
                pdVar14 = (double *)(lVar23 * 0x10 + local_180);
                do {
                  iVar6 = *(int *)(lVar10 + lVar23 * 4);
                  dVar27 = dVar27 - (x[iVar6].r * pdVar14[-1] - *pdVar14 * x[iVar6].i);
                  dVar24 = dVar24 - (x[iVar6].i * pdVar14[-1] + x[iVar6].r * *pdVar14);
                  x[lVar12].r = dVar27;
                  x[lVar12].i = dVar24;
                  lVar23 = lVar23 + 1;
                  pdVar14 = pdVar14 + 2;
                } while (iVar22 != lVar23);
              }
              lVar12 = lVar12 + 1;
              fVar28 = fVar28 + (float)((iVar22 - iVar20) * 8);
            } while (lVar12 != iVar5);
          }
          local_188 = (SuperMatrix *)CONCAT44(local_188._4_4_,fVar28);
          nsupc = iVar19;
          local_168 = dVar26;
          if (iVar19 == 1) {
            z_div(x + lVar13,x + lVar13,(doublecomplex *)(lVar21 * 0x10 + local_178));
          }
          else {
            ztrsv_("U","T","N",&nsupc,(doublecomplex *)(lVar21 * 0x10 + local_178),&nsupr,x + lVar13
                   ,&incx);
          }
          dVar26 = (double)((long)local_168 + 1);
          fVar28 = local_188._0_4_ + (float)((iVar19 * 4 + 0xe) * iVar19);
        } while ((long)local_168 < (long)*(int *)((long)local_170 + 4));
        goto LAB_0010f0ea;
      }
    }
  }
  else if (*trans == 'N') {
    if (cVar3 == 'L') {
      if (L->nrow == 0) {
        return 0;
      }
      if (-1 < *(int *)((long)pvVar8 + 4)) {
        local_150 = &local_140->i;
        local_148 = (char *)(local_178 + 0x18);
        fVar28 = 0.0;
        dVar27 = 0.0;
        dVar26 = 0.0;
        lVar15 = 0;
        do {
          lVar13 = *(long *)((long)local_170 + 0x20);
          iVar22 = *(int *)(*(long *)((long)local_170 + 0x30) + lVar15 * 4);
          lVar21 = (long)iVar22;
          uVar4 = *(uint *)(lVar13 + lVar21 * 4);
          nsupr = *(int *)(lVar13 + 4 + lVar21 * 4) - uVar4;
          iVar22 = *(int *)(*(long *)((long)local_170 + 0x30) + 4 + lVar15 * 4) - iVar22;
          iVar5 = *(int *)(*(long *)((long)local_170 + 0x10) + lVar21 * 4);
          uVar18 = nsupr - iVar22;
          nsupc = iVar22;
          if (iVar22 == 1) {
            iVar19 = *(int *)(lVar13 + 4 + lVar21 * 4);
            if ((int)((long)(int)uVar4 + 1) < iVar19) {
              lVar13 = *(long *)((long)local_170 + 0x18);
              pdVar14 = (double *)(local_148 + (long)iVar5 * 0x10);
              lVar12 = 0;
              do {
                iVar5 = *(int *)(((long)(int)uVar4 + 1) * 4 + lVar13 + lVar12 * 4);
                dVar26 = x[lVar21].r;
                dVar24 = x[lVar21].i;
                dVar27 = dVar26 * pdVar14[-1] - *pdVar14 * dVar24;
                dVar26 = dVar24 * pdVar14[-1] + dVar26 * *pdVar14;
                dVar24 = x[iVar5].i;
                x[iVar5].r = x[iVar5].r - dVar27;
                x[iVar5].i = dVar24 - dVar26;
                pdVar14 = pdVar14 + 2;
                lVar12 = lVar12 + 1;
              } while (~uVar4 + iVar19 != (int)lVar12);
            }
          }
          else {
            local_188 = (SuperMatrix *)CONCAT44(local_188._4_4_,fVar28);
            local_180 = lVar15;
            local_168 = dVar26;
            local_158 = dVar27;
            zlsolve(nsupr,iVar22,(doublecomplex *)((long)iVar5 * 0x10 + local_178),x + lVar21);
            zmatvec(nsupr,nsupr - nsupc,nsupc,
                    (doublecomplex *)((long)(nsupc + iVar5) * 0x10 + local_178),x + lVar21,local_140
                   );
            lVar15 = local_180;
            dVar26 = local_168;
            dVar27 = local_158;
            fVar28 = local_188._0_4_;
            if (0 < (int)uVar18) {
              lVar13 = *(long *)((long)local_170 + 0x18);
              uVar16 = 0;
              pdVar14 = local_150;
              do {
                iVar5 = *(int *)((long)(int)(uVar4 + nsupc) * 4 + lVar13 + uVar16 * 4);
                dVar24 = x[iVar5].i;
                x[iVar5].r = x[iVar5].r - ((doublecomplex *)(pdVar14 + -1))->r;
                x[iVar5].i = dVar24 - *pdVar14;
                ((doublecomplex *)(pdVar14 + -1))->r = local_158;
                *pdVar14 = local_168;
                uVar16 = uVar16 + 1;
                pdVar14 = pdVar14 + 2;
              } while (uVar16 < uVar18);
            }
          }
          fVar28 = fVar28 + (float)((iVar22 * 4 + 6) * iVar22) + (float)(int)(uVar18 * iVar22 * 8);
          bVar11 = lVar15 < *(int *)((long)local_170 + 4);
          lVar15 = lVar15 + 1;
        } while (bVar11);
        goto LAB_0010f0ea;
      }
    }
    else {
      if (local_188->nrow == 0) {
        return 0;
      }
      if (-1 < (long)*(int *)((long)pvVar8 + 4)) {
        local_180 = local_180 + 8;
        fVar28 = 0.0;
        lVar15 = (long)*(int *)((long)pvVar8 + 4);
        do {
          iVar22 = *(int *)(*(long *)((long)pvVar8 + 0x30) + lVar15 * 4);
          lVar21 = (long)iVar22;
          nsupr = *(int *)(*(long *)((long)pvVar8 + 0x20) + 4 + lVar21 * 4) -
                  *(int *)(*(long *)((long)pvVar8 + 0x20) + lVar21 * 4);
          nsupc = *(int *)(*(long *)((long)pvVar8 + 0x30) + 4 + lVar15 * 4) - iVar22;
          lVar13 = (long)*(int *)(*(long *)((long)pvVar8 + 0x10) + lVar21 * 4);
          local_188 = (SuperMatrix *)
                      CONCAT44(local_188._4_4_,(float)((nsupc * 4 + 0xe) * nsupc) + fVar28);
          if (nsupc == 1) {
            pdVar17 = x + lVar21;
            z_div(pdVar17,pdVar17,(doublecomplex *)(lVar13 * 0x10 + local_178));
            iVar22 = *(int *)(*(long *)((long)pvVar9 + 0x18) + lVar21 * 4);
            lVar13 = (long)iVar22;
            iVar5 = *(int *)(*(long *)((long)pvVar9 + 0x18) + 4 + lVar21 * 4);
            if (iVar22 < iVar5) {
              lVar21 = *(long *)((long)pvVar9 + 0x10);
              pdVar14 = (double *)(lVar13 * 0x10 + local_180);
              do {
                iVar22 = *(int *)(lVar21 + lVar13 * 4);
                dVar26 = pdVar17->r;
                dVar27 = pdVar17->i;
                dVar24 = pdVar14[-1];
                dVar25 = *pdVar14;
                dVar2 = x[iVar22].i;
                x[iVar22].r = x[iVar22].r - (dVar26 * dVar24 - dVar25 * dVar27);
                x[iVar22].i = dVar2 - (dVar27 * dVar24 + dVar26 * dVar25);
                lVar13 = lVar13 + 1;
                pdVar14 = pdVar14 + 2;
              } while (iVar5 != lVar13);
            }
LAB_0010ed07:
            fVar28 = local_188._0_4_;
          }
          else {
            zusolve(nsupr,nsupc,(doublecomplex *)(lVar13 * 0x10 + local_178),x + lVar21);
            iVar5 = *(int *)(*(long *)((long)pvVar8 + 0x30) + 4 + lVar15 * 4);
            if (iVar5 <= iVar22) goto LAB_0010ed07;
            lVar13 = *(long *)((long)pvVar9 + 0x18);
            fVar28 = local_188._0_4_;
            do {
              iVar22 = *(int *)(lVar13 + 4 + lVar21 * 4);
              iVar19 = *(int *)(lVar13 + lVar21 * 4);
              lVar12 = (long)iVar19;
              if (iVar22 - iVar19 != 0 && iVar19 <= iVar22) {
                lVar23 = *(long *)((long)pvVar9 + 0x10);
                pdVar14 = (double *)(lVar12 * 0x10 + local_180);
                do {
                  iVar20 = *(int *)(lVar23 + lVar12 * 4);
                  dVar26 = x[lVar21].r;
                  dVar27 = x[lVar21].i;
                  dVar24 = pdVar14[-1];
                  dVar25 = *pdVar14;
                  dVar2 = x[iVar20].i;
                  x[iVar20].r = x[iVar20].r - (dVar26 * dVar24 - dVar25 * dVar27);
                  x[iVar20].i = dVar2 - (dVar27 * dVar24 + dVar26 * dVar25);
                  lVar12 = lVar12 + 1;
                  pdVar14 = pdVar14 + 2;
                } while (iVar22 != lVar12);
              }
              lVar21 = lVar21 + 1;
              fVar28 = fVar28 + (float)((iVar22 - iVar19) * 8);
            } while (lVar21 != iVar5);
          }
          bVar11 = 0 < lVar15;
          lVar15 = lVar15 + -1;
        } while (bVar11);
        goto LAB_0010f0ea;
      }
    }
  }
  else if (cVar3 == 'L') {
    if (L->nrow == 0) {
      return 0;
    }
    dVar26 = (double)(long)*(int *)((long)pvVar8 + 4);
    if (-1 < (long)dVar26) {
      local_180 = local_178 + 8;
      fVar28 = 0.0;
      do {
        lVar15 = *(long *)((long)local_170 + 0x30);
        iVar22 = *(int *)(lVar15 + (long)dVar26 * 4);
        local_158 = (double)(long)iVar22;
        iVar5 = *(int *)(*(long *)((long)local_170 + 0x20) + (long)local_158 * 4);
        nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + (long)local_158 * 4) - iVar5;
        nsupc = *(int *)(lVar15 + 4 + (long)dVar26 * 4) - iVar22;
        lVar13 = *(long *)((long)local_170 + 0x10);
        local_150 = (double *)(long)*(int *)(lVar13 + (long)local_158 * 4);
        iVar19 = *(int *)(lVar15 + 4 + (long)dVar26 * 4);
        if (iVar22 < iVar19) {
          dVar27 = local_158;
          do {
            lVar15 = (long)*(int *)(lVar13 + (long)dVar27 * 4) + (long)nsupc;
            iVar22 = *(int *)(lVar13 + 4 + (long)dVar27 * 4);
            if ((int)lVar15 < iVar22) {
              dVar24 = x[(long)dVar27].r;
              dVar25 = x[(long)dVar27].i;
              lVar21 = *(long *)((long)local_170 + 0x18);
              lVar23 = lVar15 * 0x10 + local_180;
              lVar12 = 0;
              do {
                iVar20 = *(int *)(lVar21 + (long)(iVar5 + nsupc) * 4 + lVar12);
                temp.r = *(double *)(lVar23 + -8 + lVar12 * 4);
                dVar2 = *(double *)(lVar23 + lVar12 * 4);
                temp.i = -dVar2;
                dVar24 = dVar24 - (x[iVar20].r * temp.r + dVar2 * x[iVar20].i);
                dVar25 = dVar25 - (x[iVar20].i * temp.r - x[iVar20].r * dVar2);
                x[(long)dVar27].r = dVar24;
                x[(long)dVar27].i = dVar25;
                lVar15 = lVar15 + 1;
                lVar12 = lVar12 + 4;
              } while (lVar15 < iVar22);
            }
            dVar27 = (double)((long)dVar27 + 1);
          } while (dVar27 != (double)(long)iVar19);
        }
        fVar28 = fVar28 + (float)((nsupr - nsupc) * nsupc * 8);
        local_168 = dVar26;
        if (1 < nsupc) {
          local_188 = (SuperMatrix *)
                      CONCAT44(local_188._4_4_,fVar28 + (float)((nsupc + -1) * nsupc * 4));
          ztrsv_("L",local_148,"U",&nsupc,(doublecomplex *)((long)local_150 * 0x10 + local_178),
                 &nsupr,x + (long)local_158,&incx);
          fVar28 = local_188._0_4_;
        }
        dVar26 = (double)((long)local_168 + -1);
      } while (0 < (long)local_168);
      goto LAB_0010f0ea;
    }
  }
  else {
    if (local_188->nrow == 0) {
      return 0;
    }
    if (-1 < *(int *)((long)pvVar8 + 4)) {
      local_180 = local_180 + 8;
      fVar28 = 0.0;
      dVar26 = 0.0;
      do {
        lVar15 = *(long *)((long)local_170 + 0x30);
        iVar22 = *(int *)(lVar15 + (long)dVar26 * 4);
        lVar13 = (long)iVar22;
        nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + lVar13 * 4) -
                *(int *)(*(long *)((long)local_170 + 0x20) + lVar13 * 4);
        iVar20 = *(int *)(lVar15 + 4 + (long)dVar26 * 4) - iVar22;
        iVar5 = *(int *)(*(long *)((long)local_170 + 0x10) + lVar13 * 4);
        iVar19 = *(int *)(lVar15 + 4 + (long)dVar26 * 4);
        if (iVar22 < iVar19) {
          lVar15 = *(long *)((long)pvVar9 + 0x18);
          lVar21 = lVar13;
          do {
            iVar22 = *(int *)(lVar15 + 4 + lVar21 * 4);
            iVar6 = *(int *)(lVar15 + lVar21 * 4);
            lVar12 = (long)iVar6;
            if (iVar22 - iVar6 != 0 && iVar6 <= iVar22) {
              lVar23 = *(long *)((long)pvVar9 + 0x10);
              dVar27 = x[lVar21].r;
              dVar24 = x[lVar21].i;
              pdVar14 = (double *)(lVar12 * 0x10 + local_180);
              do {
                iVar7 = *(int *)(lVar23 + lVar12 * 4);
                temp.r = pdVar14[-1];
                dVar25 = *pdVar14;
                temp.i = -dVar25;
                dVar27 = dVar27 - (x[iVar7].r * temp.r + dVar25 * x[iVar7].i);
                dVar24 = dVar24 - (x[iVar7].i * temp.r - x[iVar7].r * dVar25);
                x[lVar21].r = dVar27;
                x[lVar21].i = dVar24;
                lVar12 = lVar12 + 1;
                pdVar14 = pdVar14 + 2;
              } while (iVar22 != lVar12);
            }
            lVar21 = lVar21 + 1;
            fVar28 = fVar28 + (float)((iVar22 - iVar6) * 8);
          } while (lVar21 != iVar19);
        }
        local_188 = (SuperMatrix *)CONCAT44(local_188._4_4_,fVar28);
        pdVar17 = (doublecomplex *)((long)iVar5 * 0x10 + local_178);
        nsupc = iVar20;
        local_168 = dVar26;
        if (iVar20 == 1) {
          temp.r = pdVar17->r;
          temp.i = -pdVar17->i;
          z_div(x + lVar13,x + lVar13,&temp);
        }
        else {
          ztrsv_("U",local_148,"N",&nsupc,pdVar17,&nsupr,x + lVar13,&incx);
        }
        dVar26 = (double)((long)local_168 + 1);
        fVar28 = local_188._0_4_ + (float)((iVar20 * 4 + 0xe) * iVar20);
      } while ((long)local_168 < (long)*(int *)((long)local_170 + 4));
      goto LAB_0010f0ea;
    }
  }
  fVar28 = 0.0;
LAB_0010f0ea:
  stat->ops[0x11] = fVar28 + stat->ops[0x11];
  superlu_free(local_140);
  return 0;
}

Assistant:

int
sp_ztrsv(char *uplo, char *trans, char *diag, SuperMatrix *L, 
         SuperMatrix *U, doublecomplex *x, SuperLUStat_t *stat, int *info)
{
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    SCformat *Lstore;
    NCformat *Ustore;
    doublecomplex   *Lval, *Uval;
    int incx = 1, incy = 1;
    doublecomplex temp;
    doublecomplex alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    doublecomplex comp_zero = {0.0, 0.0};
    int nrow, irow, jcol;
    int fsupc, nsupr, nsupc;
    int_t luptr, istart, i, k, iptr;
    doublecomplex *work;
    flops_t solve_ops;

    /* Test the input parameters */
    *info = 0;
    if ( strncmp(uplo,"L", 1)!=0 && strncmp(uplo, "U", 1)!=0 ) *info = -1;
    else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 && 
              strncmp(trans, "C", 1)!=0) *info = -2;
    else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 )
         *info = -3;
    else if ( L->nrow != L->ncol || L->nrow < 0 ) *info = -4;
    else if ( U->nrow != U->ncol || U->nrow < 0 ) *info = -5;
    if ( *info ) {
	int ii = -(*info);
	input_error("sp_ztrsv", &ii);
	return 0;
    }

    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;

    if ( !(work = doublecomplexCalloc(L->nrow)) )
	ABORT("Malloc fails for work in sp_ztrsv().");
    
    if ( strncmp(trans, "N", 1)==0 ) {	/* Form x := inv(A)*x. */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L)*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
		fsupc = L_FST_SUPC(k);
		istart = L_SUB_START(fsupc);
		nsupr = L_SUB_START(fsupc+1) - istart;
		nsupc = L_FST_SUPC(k+1) - fsupc;
		luptr = L_NZ_START(fsupc);
		nrow = nsupr - nsupc;

                /* 1 z_div costs 10 flops */
	        solve_ops += 4 * nsupc * (nsupc - 1) + 10 * nsupc;
	        solve_ops += 8 * nrow * nsupc;

		if ( nsupc == 1 ) {
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); ++iptr) {
			irow = L_SUB(iptr);
			++luptr;
			zz_mult(&comp_zero, &x[fsupc], &Lval[luptr]);
			z_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    CGEMV(ftcs2, &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#else
		    ztrsv_("L", "N", "U", &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    zgemv_("N", &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#endif
#else
		    zlsolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc]);
		
		    zmatvec ( nsupr, nsupr-nsupc, nsupc, &Lval[luptr+nsupc],
                             &x[fsupc], &work[0] );
#endif		
		
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; ++i, ++iptr) {
			irow = L_SUB(iptr);
			z_sub(&x[irow], &x[irow], &work[i]); /* Scatter */
			work[i] = comp_zero;

		    }
	 	}
	    } /* for k ... */
	    
	} else {
	    /* Form x := inv(U)*x */
	    
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; k--) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);
		
                /* 1 z_div costs 10 flops */
    	        solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    z_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		    for (i = U_NZ_START(fsupc); i < U_NZ_START(fsupc+1); ++i) {
			irow = U_SUB(i);
			zz_mult(&comp_zero, &x[fsupc], &Uval[i]);
			z_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs3, ftcs2, ftcs2, &nsupc, &Lval[luptr], &nsupr,
		       &x[fsupc], &incx);
#else
		    ztrsv_("U", "N", "N", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
#else		
		    zusolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc] );
#endif		

		    for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		        solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    	for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); 
				i++) {
			    irow = U_SUB(i);
			zz_mult(&comp_zero, &x[jcol], &Uval[i]);
			z_sub(&x[irow], &x[irow], &comp_zero);
		    	}
                    }
		}
	    } /* for k ... */
	    
	}
    } else if ( strncmp(trans, "T", 1)==0 ) { /* Form x := inv(A')*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L')*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
			zz_mult(&comp_zero, &x[irow], &Lval[i]);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
		}
		
		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
		    ztrsv_("L", "T", "U", &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := inv(U')*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
			zz_mult(&comp_zero, &x[irow], &Uval[i]);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 z_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    z_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
		    ztrsv_("U", "T", "N", &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#endif
		}
	    } /* for k ... */
	}
    } else { /* Form x := conj(inv(A'))*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := conj(inv(L'))*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
                        zz_conj(&temp, &Lval[i]);
			zz_mult(&comp_zero, &x[irow], &temp);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
 		}
 		
 		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    ZTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
                    ztrsv_("L", trans, "U", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := conj(inv(U'))*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
                        zz_conj(&temp, &Uval[i]);
			zz_mult(&comp_zero, &x[irow], &temp);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 z_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;
 
		if ( nsupc == 1 ) {
                    zz_conj(&temp, &Lval[luptr]);
		    z_div(&x[fsupc], &x[fsupc], &temp);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    ZTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
                    ztrsv_("U", trans, "N", &nsupc, &Lval[luptr], &nsupr,
                               &x[fsupc], &incx);
#endif
  		}
  	    } /* for k ... */
  	}
    }

    stat->ops[SOLVE] += solve_ops;
    SUPERLU_FREE(work);
    return 0;
}